

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

symbol * Symbol_new(char *x)

{
  char *pcVar1;
  ushort **ppuVar2;
  symbol *local_18;
  symbol *sp;
  char *x_local;
  
  local_18 = Symbol_find(x);
  if (local_18 == (symbol *)0x0) {
    local_18 = (symbol *)calloc(1,0x60);
    if (local_18 == (symbol *)0x0) {
      memory_error();
    }
    pcVar1 = Strsafe(x);
    local_18->name = pcVar1;
    ppuVar2 = __ctype_b_loc();
    local_18->type = (uint)(((*ppuVar2)[(int)*x] & 0x100) == 0);
    local_18->rule = (rule *)0x0;
    local_18->fallback = (symbol *)0x0;
    local_18->prec = -1;
    local_18->assoc = UNK;
    local_18->firstset = (char *)0x0;
    local_18->lambda = LEMON_FALSE;
    local_18->destructor = (char *)0x0;
    local_18->destLineno = 0;
    local_18->datatype = (char *)0x0;
    local_18->useCnt = 0;
    Symbol_insert(local_18,local_18->name);
  }
  local_18->useCnt = local_18->useCnt + 1;
  return local_18;
}

Assistant:

struct symbol *Symbol_new(const char *x)
{
  struct symbol *sp;

  sp = Symbol_find(x);
  if( sp==0 ){
    sp = (struct symbol *)calloc(1, sizeof(struct symbol) );
    MemoryCheck(sp);
    sp->name = Strsafe(x);
    sp->type = isupper(*x) ? TERMINAL : NONTERMINAL;
    sp->rule = 0;
    sp->fallback = 0;
    sp->prec = -1;
    sp->assoc = UNK;
    sp->firstset = 0;
    sp->lambda = LEMON_FALSE;
    sp->destructor = 0;
    sp->destLineno = 0;
    sp->datatype = 0;
    sp->useCnt = 0;
    Symbol_insert(sp,sp->name);
  }
  sp->useCnt++;
  return sp;
}